

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

LY_ERR set_assign_pos(lyxp_set *set,lyd_node *root,lyxp_node_type root_type)

{
  lyxp_node_type lVar1;
  lyxp_set_node *plVar2;
  lysc_node *plVar3;
  lyd_node_inner *plVar4;
  lyd_node_inner *plVar5;
  lys_module *plVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  lyd_node_inner *plVar9;
  bool bVar10;
  lyd_node_inner *plVar11;
  lyd_node_inner *plVar12;
  lyd_node_inner *plVar13;
  ulong uVar14;
  uint32_t uVar15;
  
  if (set->used != 0) {
    uVar14 = 0;
    uVar7 = 0;
    plVar4 = (lyd_node_inner *)0x0;
    do {
      plVar2 = (set->val).nodes;
      if (plVar2[uVar14].pos == 0) {
        lVar1 = plVar2[uVar14].type;
        if (lVar1 - LYXP_NODE_ELEM < 2) {
          plVar5 = (lyd_node_inner *)0x0;
        }
        else {
          if (lVar1 != LYXP_NODE_META) goto LAB_001ae46d;
          plVar5 = *(lyd_node_inner **)plVar2[uVar14].node;
          if (plVar5 == (lyd_node_inner *)0x0) {
            ly_log(root->schema->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                   0x610);
            return LY_EINT;
          }
        }
        if (plVar5 == (lyd_node_inner *)0x0) {
          plVar5 = (lyd_node_inner *)plVar2[uVar14].node;
        }
        if (root->prev->next != (lyd_node *)0x0) {
          __assert_fail("prev && prev_pos && !root->prev->next",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                        ,0x5b9,
                        "uint32_t get_node_pos(const struct lyd_node *, enum lyxp_node_type, const struct lyd_node *, enum lyxp_node_type, const struct lyd_node **, uint32_t *)"
                       );
        }
        uVar15 = 0;
        uVar8 = uVar7;
        if (1 < plVar2[uVar14].type - LYXP_NODE_ROOT) {
          if (plVar4 == (lyd_node_inner *)0x0) {
            uVar15 = 1;
            plVar13 = (lyd_node_inner *)0x0;
            plVar11 = (lyd_node_inner *)root;
            goto LAB_001ae3e3;
          }
          plVar11 = *(lyd_node_inner **)((long)&plVar4->field_0 + 0x10);
          plVar12 = plVar4;
          while (plVar13 = plVar11, plVar13 != (lyd_node_inner *)0x0) {
            plVar12 = plVar13;
            plVar11 = (plVar13->field_0).node.parent;
          }
          plVar11 = (lyd_node_inner *)0x0;
          uVar15 = uVar7;
LAB_001ae482:
          do {
            plVar13 = plVar4;
            if (plVar11 != (lyd_node_inner *)0x0) {
              plVar13 = plVar11;
            }
            if (plVar4 == (lyd_node_inner *)0x0) {
              plVar13 = plVar11;
            }
            if (((root_type != LYXP_NODE_ROOT_CONFIG) ||
                (plVar3 = (plVar13->field_0).node.schema, plVar3 == (lysc_node *)0x0)) ||
               (bVar10 = true, (plVar3->flags & 2) == 0)) {
              if (plVar13 == plVar5) {
                bVar10 = false;
                goto LAB_001ae514;
              }
              uVar15 = uVar15 + 1;
              bVar10 = false;
            }
            if (bVar10) {
              plVar11 = (lyd_node_inner *)0x0;
            }
            else {
              plVar11 = (lyd_node_inner *)0x0;
              if ((plVar13 != (lyd_node_inner *)0x0) &&
                 ((plVar3 = (plVar13->field_0).node.schema, plVar3 == (lysc_node *)0x0 ||
                  (plVar11 = (lyd_node_inner *)0x0, (plVar3->nodetype & 0x711) != 0)))) {
                plVar11 = (lyd_node_inner *)plVar13->child;
              }
            }
            if (plVar11 == (lyd_node_inner *)0x0) {
              if (plVar13 == plVar12) {
                bVar10 = true;
                goto LAB_001ae514;
              }
              plVar11 = (lyd_node_inner *)(plVar13->field_0).node.next;
            }
            if (plVar11 == (lyd_node_inner *)0x0) {
              for (plVar13 = (plVar13->field_0).node.parent;
                  ((plVar13->field_0).node.parent != (plVar12->field_0).node.parent &&
                  (plVar11 = (lyd_node_inner *)(plVar13->field_0).node.next,
                  plVar11 == (lyd_node_inner *)0x0)); plVar13 = (plVar13->field_0).node.parent) {
              }
            }
            do {
              bVar10 = true;
              plVar13 = (lyd_node_inner *)0x0;
              if (plVar11 != (lyd_node_inner *)0x0) goto LAB_001ae482;
LAB_001ae514:
              if (!bVar10) {
                bVar10 = false;
                plVar9 = plVar4;
                plVar11 = plVar13;
                goto LAB_001ae3f6;
              }
              plVar11 = (lyd_node_inner *)(plVar12->field_0).node.next;
LAB_001ae3e3:
              plVar12 = plVar11;
            } while (plVar11 != (lyd_node_inner *)0x0);
            bVar10 = true;
            plVar9 = plVar4;
            plVar11 = plVar13;
LAB_001ae3f6:
            plVar4 = plVar5;
            uVar8 = uVar15;
            if (!bVar10) goto LAB_001ae461;
            uVar15 = 1;
            plVar4 = (lyd_node_inner *)root;
            plVar12 = (lyd_node_inner *)root;
          } while (plVar9 != (lyd_node_inner *)0x0);
          plVar3 = (plVar5->field_0).node.schema;
          if (plVar3 == (lysc_node *)0x0) {
            plVar6 = (lys_module *)&plVar5[1].field_0.node.priv;
          }
          else {
            plVar6 = plVar3->module;
          }
          uVar15 = 0;
          ly_log(plVar6->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                 0x5e8);
          plVar4 = plVar9;
          uVar8 = uVar7;
        }
LAB_001ae461:
        (set->val).nodes[uVar14].pos = uVar15;
        uVar7 = uVar8;
      }
LAB_001ae46d:
      uVar14 = uVar14 + 1;
    } while (uVar14 < set->used);
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
set_assign_pos(struct lyxp_set *set, const struct lyd_node *root, enum lyxp_node_type root_type)
{
    const struct lyd_node *prev = NULL, *tmp_node;
    uint32_t i, tmp_pos = 0;

    for (i = 0; i < set->used; ++i) {
        if (!set->val.nodes[i].pos) {
            tmp_node = NULL;
            switch (set->val.nodes[i].type) {
            case LYXP_NODE_META:
                tmp_node = set->val.meta[i].meta->parent;
                if (!tmp_node) {
                    LOGINT_RET(root->schema->module->ctx);
                }
            /* fall through */
            case LYXP_NODE_ELEM:
            case LYXP_NODE_TEXT:
                if (!tmp_node) {
                    tmp_node = set->val.nodes[i].node;
                }
                set->val.nodes[i].pos = get_node_pos(tmp_node, set->val.nodes[i].type, root, root_type, &prev, &tmp_pos);
                break;
            default:
                /* all roots have position 0 */
                break;
            }
        }
    }

    return LY_SUCCESS;
}